

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

void __thiscall
cbtCollisionWorld::rayTest
          (cbtCollisionWorld *this,cbtVector3 *rayFromWorld,cbtVector3 *rayToWorld,
          RayResultCallback *resultCallback)

{
  cbtSingleRayCallback rayCB;
  cbtSingleRayCallback local_108;
  
  cbtSingleRayCallback::cbtSingleRayCallback(&local_108,rayFromWorld,rayToWorld,this,resultCallback)
  ;
  (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[6])
            (this->m_broadphasePairCache,rayFromWorld,rayToWorld,&local_108);
  return;
}

Assistant:

void cbtCollisionWorld::rayTest(const cbtVector3& rayFromWorld, const cbtVector3& rayToWorld, RayResultCallback& resultCallback) const
{
	//BT_PROFILE("rayTest");
	/// use the broadphase to accelerate the search for objects, based on their aabb
	/// and for each object with ray-aabb overlap, perform an exact ray test
	cbtSingleRayCallback rayCB(rayFromWorld, rayToWorld, this, resultCallback);

#ifndef USE_BRUTEFORCE_RAYBROADPHASE
	m_broadphasePairCache->rayTest(rayFromWorld, rayToWorld, rayCB);
#else
	for (int i = 0; i < this->getNumCollisionObjects(); i++)
	{
		rayCB.process(m_collisionObjects[i]->getBroadphaseHandle());
	}
#endif  //USE_BRUTEFORCE_RAYBROADPHASE
}